

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureFailureMessageIsXMLEscaped::RunImpl
          (TestXmlTestReporterFixtureFailureMessageIsXMLEscaped *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_1c0 [8];
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper fixtureHelper;
  bool ctorOk;
  TestXmlTestReporterFixtureFailureMessageIsXMLEscaped *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper::
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper
            ((XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper *)local_1c0,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper>
            ((XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper *)local_1c0,
             &(this->super_Test).m_details);
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper::
  ~XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper
            ((XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper *)local_1c0);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, FailureMessageIsXMLEscaped)
{
    TestDetails const details("TestName", "suite", "filename.h", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "\"\'&<>");
    reporter.ReportTestFinish(details, 0.1f);
    reporter.ReportSummary(1, 1, 1, 0.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"TestName\" time=\"0.1\">"
        "<failure message=\"filename.h(4321) : &quot;&apos;&amp;&lt;&gt;\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}